

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O2

QString * __thiscall
SecurityDirWrapper::translateType(QString *__return_storage_ptr__,SecurityDirWrapper *this,int type)

{
  char *ch;
  
  if (type - 1U < 9) {
    ch = &DAT_00135e78 + *(int *)(&DAT_00135e78 + (ulong)(type - 1U) * 4);
  }
  else {
    ch = "";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString SecurityDirWrapper::translateType(int type)
{
    switch (type) {
        case pe::WIN_CERT_TYPE_X509  : return "X.509 certificate";
        case pe::WIN_CERT_TYPE_PKCS_SIGNED_DATA : return "PKCS Signed Data";
        case pe::WIN_CERT_TYPE_RESERVED_1 : return "Reserved";
        case pe::WIN_CERT_TYPE_PKCS1_SIGN : return "PKCS1 Module Sign Fields";
    }
    return "";
}